

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O0

void Ssw_SmlAddPatternDyn(Ssw_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Obj_t *pObj_00;
  uint *p_01;
  int local_24;
  int nVarNum;
  int i;
  uint *pInfo;
  Aig_Obj_t *pObj;
  Ssw_Man_t *p_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->pMSat->vUsedPis);
    if (iVar1 <= local_24) {
      return;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pMSat->vUsedPis,local_24);
    iVar1 = Aig_ObjIsCi(pObj_00);
    if (iVar1 == 0) break;
    iVar1 = Ssw_ObjSatNum(p->pMSat,pObj_00);
    if (iVar1 < 1) {
      __assert_fail("nVarNum > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSweep.c"
                    ,0xa7,"void Ssw_SmlAddPatternDyn(Ssw_Man_t *)");
    }
    iVar1 = sat_solver_var_value(p->pMSat->pSat,iVar1);
    if (iVar1 != 0) {
      p_00 = p->vSimInfo;
      iVar1 = Aig_ObjCioId(pObj_00);
      p_01 = (uint *)Vec_PtrEntry(p_00,iVar1);
      Abc_InfoSetBit(p_01,p->nPatterns);
    }
    local_24 = local_24 + 1;
  }
  __assert_fail("Aig_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSweep.c"
                ,0xa5,"void Ssw_SmlAddPatternDyn(Ssw_Man_t *)");
}

Assistant:

void Ssw_SmlAddPatternDyn( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj;
    unsigned * pInfo;
    int i, nVarNum;
    // iterate through the PIs of the frames
    Vec_PtrForEachEntry( Aig_Obj_t *, p->pMSat->vUsedPis, pObj, i )
    {
        assert( Aig_ObjIsCi(pObj) );
        nVarNum = Ssw_ObjSatNum( p->pMSat, pObj );
        assert( nVarNum > 0 );
        if ( sat_solver_var_value( p->pMSat->pSat, nVarNum ) )
        {
            pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObj) );
            Abc_InfoSetBit( pInfo, p->nPatterns );
        }
    }
}